

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

_Bool Curl_conn_is_tcp_listen(Curl_easy *data,int sockindex)

{
  Curl_cfilter *pCVar1;
  
  for (pCVar1 = data->conn->cfilter[sockindex];
      (pCVar1 != (Curl_cfilter *)0x0 && (pCVar1->cft != &Curl_cft_tcp_accept));
      pCVar1 = pCVar1->next) {
  }
  return pCVar1 != (Curl_cfilter *)0x0;
}

Assistant:

bool Curl_conn_is_tcp_listen(struct Curl_easy *data,
                             int sockindex)
{
  struct Curl_cfilter *cf = data->conn->cfilter[sockindex];
  while(cf) {
    if(cf->cft == &Curl_cft_tcp_accept)
      return TRUE;
    cf = cf->next;
  }
  return FALSE;
}